

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_encoder.hpp
# Opt level: O0

bool __thiscall
jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::
visit_string(basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>
             *this,string_view_type *sv,semantic_tag tag,ser_context *param_4,error_code *param_5)

{
  bool bVar1;
  bignum_format_kind bVar2;
  reference pvVar3;
  size_t sVar4;
  const_pointer pvVar5;
  char in_DL;
  basic_string_view<char,_std::char_traits<char>_> *in_RSI;
  long in_RDI;
  stream_sink<char> *in_stack_00000078;
  bool in_stack_00000086;
  bool in_stack_00000087;
  size_t in_stack_00000088;
  char *in_stack_00000090;
  string_view_type *in_stack_00000168;
  basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>
  *in_stack_00000170;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  undefined8 in_stack_ffffffffffffffb8;
  char cVar6;
  stream_sink<char> *in_stack_ffffffffffffffc0;
  
  cVar6 = (char)((ulong)in_stack_ffffffffffffffb8 >> 0x38);
  bVar1 = std::
          vector<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
          ::empty((vector<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
                   *)in_stack_ffffffffffffffc0);
  if (!bVar1) {
    pvVar3 = std::
             vector<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
             ::back((vector<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
                     *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
    bVar1 = encoding_context::is_array(pvVar3);
    if (bVar1) {
      pvVar3 = std::
               vector<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
               ::back((vector<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
                       *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
      sVar4 = encoding_context::count(pvVar3);
      if (sVar4 != 0) {
        stream_sink<char>::push_back(in_stack_ffffffffffffffc0,cVar6);
      }
    }
  }
  if (in_DL == '\x02') {
    write_bigint_value(in_stack_00000170,in_stack_00000168);
  }
  else if ((in_DL == '\x03') &&
          (bVar2 = basic_json_encode_options<char>::bignum_format
                             ((basic_json_encode_options<char> *)(in_RDI + 0x40)), bVar2 == number))
  {
    write_bigint_value(in_stack_00000170,in_stack_00000168);
  }
  else {
    stream_sink<char>::push_back(in_stack_ffffffffffffffc0,cVar6);
    pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::data(in_RSI);
    cVar6 = (char)((ulong)pvVar5 >> 0x38);
    in_stack_ffffffffffffffc0 =
         (stream_sink<char> *)std::basic_string_view<char,_std::char_traits<char>_>::length(in_RSI);
    in_stack_ffffffffffffffb7 =
         basic_json_encode_options<char>::escape_all_non_ascii
                   ((basic_json_encode_options<char> *)(in_RDI + 0x40));
    basic_json_encode_options<char>::escape_solidus
              ((basic_json_encode_options<char> *)(in_RDI + 0x40));
    detail::escape_string<char,jsoncons::stream_sink<char>>
              (in_stack_00000090,in_stack_00000088,in_stack_00000087,in_stack_00000086,
               in_stack_00000078);
    stream_sink<char>::push_back(in_stack_ffffffffffffffc0,cVar6);
  }
  bVar1 = std::
          vector<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
          ::empty((vector<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
                   *)in_stack_ffffffffffffffc0);
  if (!bVar1) {
    pvVar3 = std::
             vector<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
             ::back((vector<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<char,_jsoncons::stream_sink<char>,_std::allocator<char>_>::encoding_context>_>
                     *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
    encoding_context::increment_count(pvVar3);
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_string(const string_view_type& sv, semantic_tag tag, const ser_context&, std::error_code&) final
        {
            if (!stack_.empty() && stack_.back().is_array() && stack_.back().count() > 0)
            {
                sink_.push_back(',');
            }

            switch (tag)
            {
                case semantic_tag::bigint:
                    write_bigint_value(sv);
                    break;
                case semantic_tag::bigdec:
                {
                    // output lossless number
                    if (options_.bignum_format() == bignum_format_kind::raw)
                    {
                        write_bigint_value(sv);
                        break;
                    }
                    JSONCONS_FALLTHROUGH;
                }
                default:
                {
                    sink_.push_back('\"');
                    jsoncons::detail::escape_string(sv.data(), sv.length(),options_.escape_all_non_ascii(),options_.escape_solidus(),sink_);
                    sink_.push_back('\"');
                    break;
                }
            }

            if (!stack_.empty())
            {
                stack_.back().increment_count();
            }
            JSONCONS_VISITOR_RETURN;
        }